

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O2

char * leveldb::EncodeVarint64(char *dst,uint64_t v)

{
  uchar *ptr;
  
  for (; 0x7f < v; v = v >> 7) {
    *dst = (byte)v | 0x80;
    dst = (char *)((byte *)dst + 1);
  }
  *dst = (byte)v;
  return (char *)((byte *)dst + 1);
}

Assistant:

char* EncodeVarint64(char* dst, uint64_t v) {
  static const int B = 128;
  unsigned char* ptr = reinterpret_cast<unsigned char*>(dst);
  while (v >= B) {
    *(ptr++) = v | B;
    v >>= 7;
  }
  *(ptr++) = static_cast<unsigned char>(v);
  return reinterpret_cast<char*>(ptr);
}